

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O3

enable_if_t<std::is_unsigned<unsigned_short>::value,_unsigned_short> __thiscall
burst::divceil<unsigned_short,unsigned_int>
          (burst *this,Integer<unsigned_short> n,Integer<unsigned_int> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_short>::value,_unsigned_short> eVar1;
  domain_error *this_00;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,n) != 0) {
    if ((short)this == 0) {
      eVar1 = 0;
    }
    else {
      eVar1 = (short)((ulong)(((uint)this & 0xffff) - 1) /
                     (CONCAT62(in_register_00000032,n) & 0xffffffff)) + 1;
    }
    return eVar1;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this_00,anon_var_dwarf_1f0b1);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }